

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O2

void __thiscall
CommandDrawInventoryBar::Parse(CommandDrawInventoryBar *this,FScanner *sc,bool fullScreenOffsets)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  EColorRange EVar4;
  FFont *pFVar5;
  
  FScanner::MustGetToken(sc,0x101);
  bVar3 = FScanner::Compare(sc,"Doom");
  if (bVar3) {
    this->style = STYLE_Doom;
  }
  else {
    bVar3 = FScanner::Compare(sc,"Heretic");
    if (bVar3) {
      this->style = STYLE_Heretic;
    }
    else {
      bVar3 = FScanner::Compare(sc,"Hexen");
      if (bVar3) {
        this->style = STYLE_Hexen;
      }
      else {
        bVar3 = FScanner::Compare(sc,"HexenStrict");
        if (bVar3) {
          this->style = STYLE_HexenStrict;
        }
        else {
          bVar3 = FScanner::Compare(sc,"Strife");
          if (bVar3) {
            this->style = STYLE_Strife;
          }
          else {
            FScanner::ScriptError(sc,"Unknown style \'%s\'.",sc->String);
          }
        }
      }
    }
  }
  FScanner::MustGetToken(sc,0x2c);
  while( true ) {
    bVar3 = FScanner::CheckToken(sc,0x101);
    if (!bVar3) break;
    bVar3 = FScanner::Compare(sc,"alwaysshow");
    if (bVar3) {
      this->alwaysShow = true;
    }
    else {
      bVar3 = FScanner::Compare(sc,"drawshadow");
      if (bVar3) {
        bVar3 = FScanner::CheckToken(sc,0x28);
        if (bVar3) {
          FScanner::MustGetToken(sc,0x104);
          this->shadowX = sc->Number;
          FScanner::MustGetToken(sc,0x2c);
          FScanner::MustGetToken(sc,0x104);
          this->shadowY = sc->Number;
          FScanner::MustGetToken(sc,0x29);
        }
        this->shadow = true;
      }
      else {
        bVar3 = FScanner::Compare(sc,"noartibox");
        if (bVar3) {
          this->noArtibox = true;
        }
        else {
          bVar3 = FScanner::Compare(sc,"noarrows");
          if (bVar3) {
            this->noArrows = true;
          }
          else {
            bVar3 = FScanner::Compare(sc,"alwaysshowcounter");
            if (bVar3) {
              this->alwaysShowCounter = true;
            }
            else {
              bVar3 = FScanner::Compare(sc,"translucent");
              if (bVar3) {
                this->translucent = true;
              }
              else {
                bVar3 = FScanner::Compare(sc,"vertical");
                if (bVar3) {
                  this->vertical = true;
                }
                else {
                  FScanner::ScriptError(sc,"Unknown flag \'%s\'.",sc->String);
                }
              }
            }
          }
        }
      }
    }
    bVar3 = FScanner::CheckToken(sc,0x7c);
    if (!bVar3) {
      FScanner::MustGetToken(sc,0x2c);
    }
  }
  FScanner::MustGetToken(sc,0x104);
  this->size = sc->Number;
  FScanner::MustGetToken(sc,0x2c);
  bVar3 = FScanner::CheckToken(sc,0x102);
  if (!bVar3) {
    FScanner::MustGetToken(sc,0x101);
  }
  pFVar5 = V_GetFont(sc->String);
  this->font = pFVar5;
  if (pFVar5 == (FFont *)0x0) {
    FScanner::ScriptError(sc,"Unknown font \'%s\'.",sc->String);
    this->font = SmallFont;
  }
  FScanner::MustGetToken(sc,0x2c);
  SBarInfoCommand::GetCoordinates
            (&this->super_SBarInfoCommand,sc,fullScreenOffsets,&this->x,&this->y);
  uVar1 = this->x;
  uVar2 = this->y;
  this->counterX = (SBarInfoCoordinate)(uVar1 + 0x34);
  this->counterY = (SBarInfoCoordinate)(uVar2 + 0x2c);
  bVar3 = FScanner::CheckToken(sc,0x2c);
  if (bVar3) {
    SBarInfoCommand::GetCoordinates
              (&this->super_SBarInfoCommand,sc,fullScreenOffsets,&this->counterX,&this->counterY);
    bVar3 = FScanner::CheckToken(sc,0x2c);
    if (bVar3) {
      EVar4 = SBarInfoCommand::GetTranslation(&this->super_SBarInfoCommand,sc);
      this->translation = EVar4;
      bVar3 = FScanner::CheckToken(sc,0x2c);
      if (bVar3) {
        FScanner::MustGetToken(sc,0x104);
        this->fontSpacing = sc->Number;
      }
    }
  }
  FScanner::MustGetToken(sc,0x3b);
  return;
}

Assistant:

void	Parse(FScanner &sc, bool fullScreenOffsets)
		{
			sc.MustGetToken(TK_Identifier);
			if(sc.Compare("Doom"))
				style = STYLE_Doom;
			else if(sc.Compare("Heretic"))
				style = STYLE_Heretic;
			else if(sc.Compare("Hexen"))
				style = STYLE_Hexen;
			else if(sc.Compare("HexenStrict"))
				style = STYLE_HexenStrict;
			else if(sc.Compare("Strife"))
				style = STYLE_Strife;
			else
				sc.ScriptError("Unknown style '%s'.", sc.String);
		
			sc.MustGetToken(',');
			while(sc.CheckToken(TK_Identifier))
			{
				if(sc.Compare("alwaysshow"))
					alwaysShow = true;
				else if(sc.Compare("drawshadow"))
				{
					if(sc.CheckToken('('))
					{
						sc.MustGetToken(TK_IntConst);
						shadowX = sc.Number;
						sc.MustGetToken(',');
						sc.MustGetToken(TK_IntConst);
						shadowY = sc.Number;
						sc.MustGetToken(')');
					}
					shadow = true;
				}
				else if(sc.Compare("noartibox"))
					noArtibox = true;
				else if(sc.Compare("noarrows"))
					noArrows = true;
				else if(sc.Compare("alwaysshowcounter"))
					alwaysShowCounter = true;
				else if(sc.Compare("translucent"))
					translucent = true;
				else if(sc.Compare("vertical"))
					vertical = true;
				else
					sc.ScriptError("Unknown flag '%s'.", sc.String);
				if(!sc.CheckToken('|'))
					sc.MustGetToken(',');
			}
			sc.MustGetToken(TK_IntConst);
			size = sc.Number;
			sc.MustGetToken(',');
			if(!sc.CheckToken(TK_StringConst))
				sc.MustGetToken(TK_Identifier);
			font = V_GetFont(sc.String);
			if(font == NULL)
			{
				sc.ScriptError("Unknown font '%s'.", sc.String);
				font = SmallFont;
			}
		
			sc.MustGetToken(',');
			GetCoordinates(sc, fullScreenOffsets, x, y);
			counterX = x + 26;
			counterY = y + 22;
			if(sc.CheckToken(',')) //more font information
			{
				GetCoordinates(sc, fullScreenOffsets, counterX, counterY);
				if(sc.CheckToken(','))
				{
					translation = GetTranslation(sc);
					if(sc.CheckToken(','))
					{
						sc.MustGetToken(TK_IntConst);
						fontSpacing = sc.Number;
					}
				}
			}
			sc.MustGetToken(';');
		}